

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task.hpp
# Opt level: O1

void __thiscall duckdb::Task::Reschedule(Task *this)

{
  InternalException *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"Cannot reschedule task of base Task class","");
  duckdb::InternalException::InternalException(this_00,(string *)local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

virtual void Reschedule() {
		throw InternalException("Cannot reschedule task of base Task class");
	}